

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

void __thiscall
dlib::any_function<void_(unsigned_long),_void,_1UL>::any_function
          (any_function<void_(unsigned_long),_void,_1UL> *this,
          any_function<void_(unsigned_long),_void,_1UL> *item)

{
  bool bVar1;
  pointer pTVar2;
  undefined8 in_RDI;
  unique_ptr<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::
  unique_ptr<dlib::any_function<void(unsigned_long),void,1ul>::Tbase<void(unsigned_long)>,std::default_delete<dlib::any_function<void(unsigned_long),void,1ul>::Tbase<void(unsigned_long)>>>
  ::
  unique_ptr<std::default_delete<dlib::any_function<void(unsigned_long),void,1ul>::Tbase<void(unsigned_long)>>,void>
            (in_stack_ffffffffffffffe0);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
                      *)0x483b96);
  if (bVar1) {
    pTVar2 = std::
             unique_ptr<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
             ::operator->((unique_ptr<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
                           *)0x483ba6);
    (*pTVar2->_vptr_Tbase[3])(pTVar2,in_RDI);
  }
  return;
}

Assistant:

any_function (
    const any_function& item
)
{
    if (item.data)
    {
        item.data->copy_to(data);
    }
}